

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3ReadBlock(Fts3Table *p,sqlite3_int64 iBlockid,char **paBlob,int *pnBlob,int *pnLoad)

{
  char *pcVar1;
  char *local_48;
  char *aByte;
  int nByte;
  int rc;
  int *pnLoad_local;
  int *pnBlob_local;
  char **paBlob_local;
  sqlite3_int64 iBlockid_local;
  Fts3Table *p_local;
  
  if (p->pSegments == (sqlite3_blob *)0x0) {
    if (p->zSegmentsTbl == (char *)0x0) {
      pcVar1 = sqlite3_mprintf("%s_segments",p->zName);
      p->zSegmentsTbl = pcVar1;
      if (p->zSegmentsTbl == (char *)0x0) {
        return 7;
      }
    }
    aByte._4_4_ = sqlite3_blob_open(p->db,p->zDb,p->zSegmentsTbl,"block",iBlockid,0,&p->pSegments);
  }
  else {
    aByte._4_4_ = sqlite3_blob_reopen(p->pSegments,iBlockid);
  }
  if (aByte._4_4_ == 0) {
    aByte._0_4_ = sqlite3_blob_bytes(p->pSegments);
    *pnBlob = (int)aByte;
    if (paBlob != (char **)0x0) {
      local_48 = (char *)sqlite3_malloc((int)aByte + 0x14);
      if (local_48 == (char *)0x0) {
        aByte._4_4_ = 7;
      }
      else {
        if ((pnLoad != (int *)0x0) && (0x4000 < (int)aByte)) {
          aByte._0_4_ = 0x1000;
          *pnLoad = 0x1000;
        }
        aByte._4_4_ = sqlite3_blob_read(p->pSegments,local_48,(int)aByte,0);
        memset(local_48 + (int)aByte,0,0x14);
        if (aByte._4_4_ != 0) {
          sqlite3_free(local_48);
          local_48 = (char *)0x0;
        }
      }
      *paBlob = local_48;
    }
  }
  return aByte._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3ReadBlock(
  Fts3Table *p,                   /* FTS3 table handle */
  sqlite3_int64 iBlockid,         /* Access the row with blockid=$iBlockid */
  char **paBlob,                  /* OUT: Blob data in malloc'd buffer */
  int *pnBlob,                    /* OUT: Size of blob data */
  int *pnLoad                     /* OUT: Bytes actually loaded */
){
  int rc;                         /* Return code */

  /* pnBlob must be non-NULL. paBlob may be NULL or non-NULL. */
  assert( pnBlob );

  if( p->pSegments ){
    rc = sqlite3_blob_reopen(p->pSegments, iBlockid);
  }else{
    if( 0==p->zSegmentsTbl ){
      p->zSegmentsTbl = sqlite3_mprintf("%s_segments", p->zName);
      if( 0==p->zSegmentsTbl ) return SQLITE_NOMEM;
    }
    rc = sqlite3_blob_open(
       p->db, p->zDb, p->zSegmentsTbl, "block", iBlockid, 0, &p->pSegments
    );
  }

  if( rc==SQLITE_OK ){
    int nByte = sqlite3_blob_bytes(p->pSegments);
    *pnBlob = nByte;
    if( paBlob ){
      char *aByte = sqlite3_malloc(nByte + FTS3_NODE_PADDING);
      if( !aByte ){
        rc = SQLITE_NOMEM;
      }else{
        if( pnLoad && nByte>(FTS3_NODE_CHUNK_THRESHOLD) ){
          nByte = FTS3_NODE_CHUNKSIZE;
          *pnLoad = nByte;
        }
        rc = sqlite3_blob_read(p->pSegments, aByte, nByte, 0);
        memset(&aByte[nByte], 0, FTS3_NODE_PADDING);
        if( rc!=SQLITE_OK ){
          sqlite3_free(aByte);
          aByte = 0;
        }
      }
      *paBlob = aByte;
    }
  }

  return rc;
}